

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

uint64_t Imf_3_4::anon_unknown_6::writeLineOffsets
                   (OStream *os,vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets)

{
  uint64_t uVar1;
  OStream *out;
  OStream *pOVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long *in_RDI;
  uint i;
  uint64_t pos;
  long *v;
  uint local_50;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  uVar1 = (**(code **)(*in_RDI + 0x18))();
  if (uVar1 == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    Iex_3_4::throwErrnoExc(local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  local_50 = 0;
  while( true ) {
    out = (OStream *)(ulong)local_50;
    pOVar2 = (OStream *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    if (pOVar2 <= out) break;
    v = in_RDI;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,(ulong)local_50);
    Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(out,(uint64_t)v);
    local_50 = local_50 + 1;
  }
  return uVar1;
}

Assistant:

uint64_t
writeLineOffsets (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const vector<uint64_t>&                  lineOffsets)
{
    uint64_t pos = os.tellp ();

    if (pos == static_cast<uint64_t> (-1))
        IEX_NAMESPACE::throwErrnoExc (
            "Cannot determine current file position (%T).");

    for (unsigned int i = 0; i < lineOffsets.size (); i++)
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, lineOffsets[i]);

    return pos;
}